

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wsi.c
# Opt level: O3

void lws_rx_flow_allow_all_protocol(lws_context *context,lws_protocols *protocol)

{
  lws *wsi;
  uint uVar1;
  ulong uVar2;
  lws_context_per_thread *plVar3;
  
  uVar1 = (uint)context->count_threads;
  if (context->count_threads != 0) {
    plVar3 = context->pt;
    do {
      if (plVar3->fds_count != 0) {
        uVar2 = 0;
        do {
          wsi = wsi_from_fd(context,plVar3->fds[uVar2].fd);
          if ((wsi != (lws *)0x0) && ((wsi->a).protocol == protocol)) {
            lws_rx_flow_control(wsi,1);
          }
          uVar2 = uVar2 + 1;
        } while (uVar2 < plVar3->fds_count);
      }
      uVar1 = uVar1 - 1;
      plVar3 = plVar3 + 1;
    } while (uVar1 != 0);
  }
  return;
}

Assistant:

void
lws_rx_flow_allow_all_protocol(const struct lws_context *context,
			       const struct lws_protocols *protocol)
{
	const struct lws_context_per_thread *pt = &context->pt[0];
	struct lws *wsi;
	unsigned int n, m = context->count_threads;

	while (m--) {
		for (n = 0; n < pt->fds_count; n++) {
			wsi = wsi_from_fd(context, pt->fds[n].fd);
			if (!wsi)
				continue;
			if (wsi->a.protocol == protocol)
				lws_rx_flow_control(wsi, LWS_RXFLOW_ALLOW);
		}
		pt++;
	}
}